

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_ORR_zzz(DisasContext_conflict1 *s,arg_rrr_esz *a)

{
  _Bool _Var1;
  arg_rrr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  _Var1 = do_vector3_z(s,tcg_gen_gvec_or_aarch64,0,a->rd,a->rn,a->rm);
  return _Var1;
}

Assistant:

static bool trans_ORR_zzz(DisasContext *s, arg_rrr_esz *a)
{
    return do_vector3_z(s, tcg_gen_gvec_or, 0, a->rd, a->rn, a->rm);
}